

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O2

void __thiscall
CheckedSharedMutexTest_UnmatchUnlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedSharedMutexTest_UnmatchUnlock_Test<yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  bool bVar1;
  AssertHelper aAStack_e8 [2];
  char *local_d8;
  undefined8 local_d0;
  char local_c8 [16];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b8 [4];
  TypeParam mtx;
  
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)&mtx);
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  local_d0 = 0;
  local_d8 = local_c8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::lock_shared
              ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)&mtx);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  local_d0 = 0;
  local_d8 = local_c8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock
              ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)&mtx);
  }
  std::__cxx11::string::assign((char *)&local_d8);
  testing::Message::Message((Message *)local_b8);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x154,local_d8);
  testing::internal::AssertHelper::operator=(aAStack_e8,(Message *)local_b8);
  testing::internal::AssertHelper::~AssertHelper(aAStack_e8);
  if (local_b8[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_b8[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&local_d8);
  local_c8[0] = '\0';
  local_c8[1] = '\0';
  local_c8[2] = '\0';
  local_c8[3] = '\0';
  local_c8[4] = '\0';
  local_c8[5] = '\0';
  local_c8[6] = '\0';
  local_c8[7] = '\0';
  local_c8[8] = '\0';
  local_c8[9] = '\0';
  local_c8[10] = '\0';
  local_c8[0xb] = '\0';
  local_c8[0xc] = '\0';
  local_c8[0xd] = '\0';
  local_c8[0xe] = '\0';
  local_c8[0xf] = '\0';
  local_d0 = 0;
  local_d8 = local_c8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
              ((shared_mutex_base<yamc::rwlock::ReaderPrefer> *)&mtx);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  yamc::checked::basic_shared_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_mutex
            ((basic_shared_mutex<yamc::rwlock::ReaderPrefer> *)&mtx);
  return;
}

Assistant:

TYPED_TEST(CheckedSharedMutexTest, UnmatchUnlock) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock_shared());
  EXPECT_CHECK_FAILURE(mtx.unlock());
  ASSERT_NO_THROW(mtx.unlock_shared());
}